

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_chronicle_settings.cpp
# Opt level: O0

void __thiscall
cornelich::vanilla_chronicle_settings::vanilla_chronicle_settings
          (vanilla_chronicle_settings *this,string *path)

{
  shared_ptr<cornelich::cycle_formatter_yyyymmdd> local_28;
  string *local_18;
  string *path_local;
  vanilla_chronicle_settings *this_local;
  
  local_18 = path;
  path_local = &this->m_path;
  std::__cxx11::string::string((string *)this,(string *)path);
  this->m_thread_id_bits = 0x10;
  this->m_cycle_length = 86400000;
  std::make_shared<cornelich::cycle_formatter_yyyymmdd,int&>((int *)&local_28);
  std::shared_ptr<cornelich::cycle_formatter>::shared_ptr<cornelich::cycle_formatter_yyyymmdd,void>
            (&this->m_cycle_format,&local_28);
  std::shared_ptr<cornelich::cycle_formatter_yyyymmdd>::~shared_ptr(&local_28);
  this->m_entries_per_cycle = 0x10000000000;
  this->m_index_block_size = 0x1000000;
  this->m_data_block_size = 0x4000000;
  this->m_index_cache_size = 8;
  this->m_data_cache_size = 0x10;
  return;
}

Assistant:

vanilla_chronicle_settings::vanilla_chronicle_settings(const std::string & path)
    : m_path(path)
    , m_thread_id_bits(DEFAULT_THREAD_ID_BITS)
    , m_cycle_length(24 * 60 * 60 * 1000) // MILLIS_PER_DAY
    , m_cycle_format(std::make_shared<cycle_formatter_yyyymmdd>(m_cycle_length))
    , m_entries_per_cycle(1ULL << 40)
    , m_index_block_size(16ULL << 20) // 16MB
    , m_data_block_size(64ULL << 20) // 64MB
    , m_index_cache_size(8)
    , m_data_cache_size(16)
{
}